

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereBoxCollisionAlgorithm.cpp
# Opt level: O2

bool __thiscall
cbtSphereBoxCollisionAlgorithm::getSphereDistance
          (cbtSphereBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *boxObjWrap,
          cbtVector3 *pointOnBox,cbtVector3 *normal,cbtScalar *penetrationDepth,
          cbtVector3 *sphereCenter,cbtScalar fRadius,cbtScalar maxContactDistance)

{
  uint uVar1;
  cbtCollisionShape *pcVar2;
  cbtTransform *this_00;
  float fVar3;
  cbtScalar acVar4 [4];
  undefined1 auVar5 [16];
  cbtSphereBoxCollisionAlgorithm *this_01;
  undefined1 auVar6 [16];
  cbtScalar cVar7;
  undefined8 uVar14;
  undefined1 auVar8 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [64];
  undefined1 auVar15 [56];
  undefined1 auVar10 [64];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  cbtVector3 cVar23;
  cbtScalar distance;
  cbtScalar boxMargin;
  cbtVector3 sphereRelPos;
  float local_7c;
  cbtScalar local_78;
  float local_74;
  float local_70;
  float local_6c;
  cbtVector3 local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  cbtVector3 local_40;
  undefined1 extraout_var [60];
  undefined1 auVar19 [56];
  
  auVar19 = in_register_00001244._4_56_;
  auVar9._4_60_ = in_register_00001204;
  auVar9._0_4_ = fRadius;
  pcVar2 = boxObjWrap->m_shape;
  local_58._0_4_ = fRadius;
  (*pcVar2->_vptr_cbtCollisionShape[0xc])(pcVar2);
  auVar15 = auVar9._8_56_;
  *penetrationDepth = 1.0;
  this_00 = boxObjWrap->m_worldTransform;
  local_6c = auVar9._0_4_;
  cVar23 = cbtTransform::invXform(this_00,sphereCenter);
  auVar16._0_8_ = cVar23.m_floats._8_8_;
  auVar16._8_56_ = auVar19;
  auVar10._0_8_ = cVar23.m_floats._0_8_;
  auVar10._8_56_ = auVar15;
  acVar4 = (cbtScalar  [4])vmovlhps_avx(auVar10._0_16_,auVar16._0_16_);
  local_40.m_floats._0_8_ = acVar4._0_8_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)&pcVar2[1].field_0xc;
  auVar22._8_8_ = 0;
  auVar22._0_4_ = local_40.m_floats[0];
  auVar22._4_4_ = local_40.m_floats[1];
  auVar6 = vminps_avx(auVar6,auVar22);
  auVar20._0_8_ = *(ulong *)&pcVar2[1].field_0xc ^ 0x8000000080000000;
  auVar20._8_4_ = 0x80000000;
  auVar20._12_4_ = 0x80000000;
  auVar20 = vmaxps_avx(auVar20,auVar6);
  local_68.m_floats._0_8_ = vmovlps_avx(auVar20);
  auVar22 = vsubps_avx(auVar10._0_16_,auVar20);
  uVar1 = *(uint *)((long)&pcVar2[1].m_userPointer + 4);
  local_68.m_floats[2] = acVar4[2];
  auVar6 = vminss_avx(ZEXT416(uVar1),ZEXT416((uint)local_68.m_floats[2]));
  auVar21._0_4_ = uVar1 ^ 0x80000000;
  auVar21._4_4_ = 0x80000000;
  auVar21._8_4_ = 0x80000000;
  auVar21._12_4_ = 0x80000000;
  auVar6 = vmaxss_avx(auVar21,auVar6);
  local_70 = auVar9._0_4_ + (float)local_58._0_4_;
  local_7c = auVar6._0_4_;
  local_68.m_floats[3] = acVar4[3];
  local_68.m_floats[2] = local_7c;
  auVar6 = vinsertps_avx(auVar22,ZEXT416((uint)(cVar23.m_floats[2] - local_7c)),0x28);
  *(undefined1 (*) [16])normal->m_floats = auVar6;
  fVar3 = local_70 + maxContactDistance;
  this_01 = (cbtSphereBoxCollisionAlgorithm *)normal;
  _local_58 = auVar20;
  local_40.m_floats = acVar4;
  cVar7 = cbtVector3::length2(normal);
  local_74 = fVar3 * fVar3;
  if (cVar7 <= local_74) {
    if (cVar7 <= 1.1920929e-07) {
      auVar11._0_4_ =
           getSpherePenetration
                     (this_01,(cbtVector3 *)&pcVar2[1].field_0xc,&local_40,&local_68,normal);
      auVar11._4_60_ = extraout_var;
      auVar5._8_4_ = 0x80000000;
      auVar5._0_8_ = 0x8000000080000000;
      auVar5._12_4_ = 0x80000000;
      auVar6 = vxorps_avx512vl(auVar11._0_16_,auVar5);
      uVar14 = auVar6._8_8_;
      local_78 = auVar6._0_4_;
      _fStack_50 = 0;
      local_58._0_4_ = local_68.m_floats[0];
      local_58._4_4_ = local_68.m_floats[1];
      local_7c = local_68.m_floats[2];
    }
    else {
      local_78 = cbtVector3::length(normal);
      uVar14 = extraout_XMM0_Qb;
      cbtVector3::operator/=(normal,&local_78);
    }
    cVar23 = ::operator*(normal,&local_6c);
    auVar8._0_4_ = cVar23.m_floats[0] + (float)local_58._0_4_;
    auVar8._4_4_ = cVar23.m_floats[1] + (float)local_58._4_4_;
    auVar8._8_4_ = (float)uVar14 + fStack_50;
    auVar8._12_4_ = (float)((ulong)uVar14 >> 0x20) + fStack_4c;
    auVar19 = (undefined1  [56])0x0;
    auVar6 = vinsertps_avx(auVar8,ZEXT416((uint)(cVar23.m_floats[2] + local_7c)),0x28);
    *(undefined1 (*) [16])pointOnBox->m_floats = auVar6;
    auVar15 = (undefined1  [56])0x0;
    *penetrationDepth = local_78 - local_70;
    cVar23 = cbtTransform::operator()(this_00,pointOnBox);
    auVar17._0_8_ = cVar23.m_floats._8_8_;
    auVar17._8_56_ = auVar19;
    auVar12._0_8_ = cVar23.m_floats._0_8_;
    auVar12._8_56_ = auVar15;
    auVar6 = vmovlhps_avx(auVar12._0_16_,auVar17._0_16_);
    auVar15 = ZEXT856(auVar6._8_8_);
    *(undefined1 (*) [16])pointOnBox->m_floats = auVar6;
    cVar23 = ::operator*(&this_00->m_basis,normal);
    auVar18._0_8_ = cVar23.m_floats._8_8_;
    auVar18._8_56_ = auVar19;
    auVar13._0_8_ = cVar23.m_floats._0_8_;
    auVar13._8_56_ = auVar15;
    auVar6 = vmovlhps_avx(auVar13._0_16_,auVar18._0_16_);
    *(undefined1 (*) [16])normal->m_floats = auVar6;
  }
  return cVar7 <= local_74;
}

Assistant:

bool cbtSphereBoxCollisionAlgorithm::getSphereDistance(const cbtCollisionObjectWrapper* boxObjWrap, cbtVector3& pointOnBox, cbtVector3& normal, cbtScalar& penetrationDepth, const cbtVector3& sphereCenter, cbtScalar fRadius, cbtScalar maxContactDistance)
{
	const cbtBoxShape* boxShape = (const cbtBoxShape*)boxObjWrap->getCollisionShape();
	cbtVector3 const& boxHalfExtent = boxShape->getHalfExtentsWithoutMargin();
	cbtScalar boxMargin = boxShape->getMargin();
	penetrationDepth = 1.0f;

	// convert the sphere position to the box's local space
	cbtTransform const& m44T = boxObjWrap->getWorldTransform();
	cbtVector3 sphereRelPos = m44T.invXform(sphereCenter);

	// Determine the closest point to the sphere center in the box
	cbtVector3 closestPoint = sphereRelPos;
	closestPoint.setX(cbtMin(boxHalfExtent.getX(), closestPoint.getX()));
	closestPoint.setX(cbtMax(-boxHalfExtent.getX(), closestPoint.getX()));
	closestPoint.setY(cbtMin(boxHalfExtent.getY(), closestPoint.getY()));
	closestPoint.setY(cbtMax(-boxHalfExtent.getY(), closestPoint.getY()));
	closestPoint.setZ(cbtMin(boxHalfExtent.getZ(), closestPoint.getZ()));
	closestPoint.setZ(cbtMax(-boxHalfExtent.getZ(), closestPoint.getZ()));

	cbtScalar intersectionDist = fRadius + boxMargin;
	cbtScalar contactDist = intersectionDist + maxContactDistance;
	normal = sphereRelPos - closestPoint;

	//if there is no penetration, we are done
	cbtScalar dist2 = normal.length2();
	if (dist2 > contactDist * contactDist)
	{
		return false;
	}

	cbtScalar distance;

	//special case if the sphere center is inside the box
	if (dist2 <= SIMD_EPSILON)
	{
		distance = -getSpherePenetration(boxHalfExtent, sphereRelPos, closestPoint, normal);
	}
	else  //compute the penetration details
	{
		distance = normal.length();
		normal /= distance;
	}

	pointOnBox = closestPoint + normal * boxMargin;
	//	v3PointOnSphere = sphereRelPos - (normal * fRadius);
	penetrationDepth = distance - intersectionDist;

	// transform back in world space
	cbtVector3 tmp = m44T(pointOnBox);
	pointOnBox = tmp;
	//	tmp = m44T(v3PointOnSphere);
	//	v3PointOnSphere = tmp;
	tmp = m44T.getBasis() * normal;
	normal = tmp;

	return true;
}